

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Sparsemax::backward_impl
          (Sparsemax *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  CoeffReturnType pfVar1;
  Scalar *pSVar2;
  long in_RDI;
  float fVar3;
  int i_2;
  int i_1;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *d;
  float dhat;
  int *support;
  int ssize;
  Index in_stack_ffffffffffffff70;
  Index in_stack_ffffffffffffff78;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int iVar4;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar5;
  undefined1 local_70 [32];
  undefined1 *local_50;
  float local_44;
  long local_40;
  int local_34;
  
  local_34 = **(int **)(in_RDI + 0x48);
  local_40 = *(long *)(in_RDI + 0x48) + 4;
  local_44 = 0.0;
  Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_50 = local_70;
  for (iVar5 = 0; iVar5 < local_34; iVar5 = iVar5 + 1) {
    pfVar1 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70);
    local_44 = *pfVar1 + local_44;
  }
  local_44 = local_44 / (float)local_34;
  for (iVar4 = 0; iVar4 < local_34; iVar4 = iVar4 + 1) {
    pfVar1 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70);
    fVar3 = *pfVar1 - local_44;
    Tensor::operator*((Tensor *)CONCAT44(iVar5,iVar4));
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70);
    *pSVar2 = fVar3 + *pSVar2;
  }
  return;
}

Assistant:

void Sparsemax::backward_impl(const vector<const Tensor*>& xs,
                              const Tensor& fx,
                              const Tensor& dEdf,
                              unsigned i,
                              Tensor& dEdxi) const {
#if HAVE_CUDA
  throw std::runtime_error("Sparsemax not implemented on GPU");
#else
  const int ssize = static_cast<int*>(aux_mem)[0];
  int *support = static_cast<int*>(aux_mem) + 1;
  float dhat = 0;
  auto& d = *dEdf;
  for (int i = 0; i < ssize; ++i)
    dhat += d(support[i], 0);
  dhat /= ssize;
  for (int i = 0; i < ssize; ++i)
    (*dEdxi)(support[i], 0) += d(support[i], 0) - dhat;
#endif
}